

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

bool RigidBodyDynamics::Math::LinSolveGaussElimPivot(MatrixNd *A,VectorNd *b,VectorNd *x)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Index IVar5;
  ulong uVar6;
  void *pvVar7;
  Scalar *pSVar8;
  ostream *poVar9;
  Scalar *pSVar10;
  double dVar11;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_00000088;
  ostream *in_stack_00000090;
  Scalar d;
  uint p_swap;
  Scalar pt;
  Scalar pv;
  uint k;
  uint j;
  uint i;
  VectorNd px;
  size_t *pivot;
  uint pi;
  uint n;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe38;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffe40;
  Index in_stack_fffffffffffffe48;
  double local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  
  Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffe48);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
  ;
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6a96fe);
  uVar3 = (uint)IVar5;
  uVar6 = SUB168(ZEXT416(uVar3) * ZEXT816(8),0);
  if (SUB168(ZEXT416(uVar3) * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe40,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe38);
  for (local_54 = 0; local_54 < uVar3; local_54 = local_54 + 1) {
    *(ulong *)((long)pvVar7 + (ulong)local_54 * 8) = (ulong)local_54;
  }
  for (local_58 = 0; local_54 = uVar3, local_58 < uVar3; local_58 = local_58 + 1) {
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a97e3);
    local_68 = ABS(*pSVar8);
    for (local_5c = local_58; local_54 = local_58, local_5c < uVar3; local_5c = local_5c + 1) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9858);
      dVar1 = *pSVar8;
      if (local_68 < ABS(dVar1)) {
        uVar6 = *(ulong *)((long)pvVar7 + (ulong)local_58 * 8);
        *(undefined8 *)((long)pvVar7 + (ulong)local_58 * 8) =
             *(undefined8 *)((long)pvVar7 + (ulong)local_5c * 8);
        *(ulong *)((long)pvVar7 + (ulong)local_5c * 8) = uVar6 & 0xffffffff;
        local_68 = ABS(dVar1);
      }
    }
    while (local_54 = local_54 + 1, local_54 < uVar3) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a999d);
      dVar1 = *pSVar8;
      dVar11 = std::numeric_limits<double>::epsilon();
      if (ABS(dVar1) <= dVar11) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Error: pivoting failed for matrix A = ");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        poVar9 = std::operator<<((ostream *)&std::cerr,"A = ");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        poVar9 = Eigen::operator<<(in_stack_00000090,in_stack_00000088);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cerr,"b = ");
        poVar9 = Eigen::operator<<(in_stack_00000090,
                                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   in_stack_00000088);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9aff);
      dVar1 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9b40);
      dVar11 = *pSVar8;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
      dVar2 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
      *pSVar10 = -dVar2 * (dVar1 / dVar11) + *pSVar10;
      for (local_5c = local_58; local_5c < uVar3; local_5c = local_5c + 1) {
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9c5f);
        dVar2 = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9cb9);
        *pSVar8 = -dVar2 * (dVar1 / dVar11) + *pSVar8;
      }
    }
  }
  do {
    uVar4 = local_54 - 1;
    for (local_58 = local_54; local_58 < uVar3; local_58 = local_58 + 1) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9db7);
      dVar1 = *pSVar8;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
      dVar11 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
      *pSVar10 = dVar1 * dVar11 + *pSVar10;
    }
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
    dVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
    dVar11 = *pSVar10;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x6a9ed1);
    dVar2 = *pSVar8;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
    *pSVar10 = (dVar1 - dVar11) / dVar2;
    local_54 = uVar4;
  } while (uVar4 != 0);
  for (local_54 = 0; local_54 < uVar3; local_54 = local_54 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe40 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)*pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38);
    *pSVar10 = (Scalar)in_stack_fffffffffffffe40;
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6a9fe6);
  return true;
}

Assistant:

RBDL_DLLAPI bool LinSolveGaussElimPivot (MatrixNd A, VectorNd b, VectorNd &x) {
  x = VectorNd::Zero(x.size());

  // We can only solve quadratic systems
  assert (A.rows() == A.cols());

  unsigned int n = A.rows();
  unsigned int pi;

  // the pivots
  size_t *pivot = new size_t[n];

  // temporary result vector which contains the pivoted result
  VectorNd px(x);

  unsigned int i,j,k;

  for (i = 0; i < n; i++)
    pivot[i] = i;

  for (j = 0; j < n; j++) {
    pi = j;
    Scalar pv = fabs (A(j,pivot[j]));

    // LOG << "j = " << j << " pv = " << pv << std::endl;
    // find the pivot
    for (k = j; k < n; k++) {
      Scalar pt = fabs (A(j,pivot[k]));
      if (pt > pv) {
        pv = pt;
        pi = k;
        unsigned int p_swap = pivot[j];
        pivot[j] = pivot[pi];
        pivot[pi] = p_swap;
        //	LOG << "swap " << j << " with " << pi << std::endl;
        //	LOG << "j = " << j << " pv = " << pv << std::endl;
      }
    }

    for (i = j + 1; i < n; i++) {
      if (Scalar(fabs(A(j,pivot[j]))) <= Scalar(std::numeric_limits<double>::epsilon())) {
        std::cerr << "Error: pivoting failed for matrix A = " << std::endl;
        std::cerr << "A = " << std::endl << A << std::endl;
        std::cerr << "b = " << b << std::endl;
      }
      //		assert (fabs(A(j,pivot[j])) > std::numeric_limits<double>::epsilon());
      Scalar d = A(i,pivot[j])/A(j,pivot[j]);

      b[i] -= b[j] * d;

      for (k = j; k < n; k++) {
        A(i,pivot[k]) -= A(j,pivot[k]) * d;
      }
    }
  }

  // warning: i is an unsigned int, therefore a for loop of the 
  // form "for (i = n - 1; i >= 0; i--)" might end up in getting an invalid
  // value for i!
  i = n;
  do {
    i--;

    for (j = i + 1; j < n; j++) {
      px[i] += A(i,pivot[j]) * px[j];
    }
    px[i] = (b[i] - px[i]) / A(i,pivot[i]);

  } while (i > 0);

  // Unswapping
  for (i = 0; i < n; i++) {
    x[pivot[i]] = px[i];
  }

  /*
     LOG << "A = " << std::endl << A << std::endl;
     LOG << "b = " << b << std::endl;
     LOG << "x = " << x << std::endl;
     LOG << "pivot = " << pivot[0] << " " << pivot[1] << " " << pivot[2] << std::endl;
     std::cout << LogOutput.str() << std::endl;
     */

  delete[] pivot;

  return true;
}